

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void mi_option_set_enabled(mi_option_t option,_Bool enable)

{
  ulong uVar1;
  undefined3 in_register_00000031;
  ulong uVar2;
  
  uVar2 = (ulong)option;
  if (option < _mi_option_last) {
    uVar1 = (ulong)CONCAT31(in_register_00000031,enable);
    do {
      while( true ) {
        options[uVar2].value = uVar1;
        options[uVar2].init = INITIALIZED;
        if (options[uVar2].option == mi_option_guarded_max) break;
        if (options[uVar2].option != mi_option_guarded_min) {
          return;
        }
        uVar2 = 0x1f;
        if ((long)uVar1 <= options[0x1f].value) {
          return;
        }
      }
      uVar2 = 0x1e;
    } while ((long)uVar1 < options[0x1e].value);
  }
  return;
}

Assistant:

void mi_option_set_enabled(mi_option_t option, bool enable) {
  mi_option_set(option, (enable ? 1 : 0));
}